

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_connection.c
# Opt level: O0

void on_cbs_open_complete(void *context,CBS_OPEN_COMPLETE_RESULT open_complete_result)

{
  LOGGER_LOG p_Var1;
  LOGGER_LOG l;
  CBS_OPEN_COMPLETE_RESULT open_complete_result_local;
  void *context_local;
  
  if (open_complete_result != CBS_OPEN_OK) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_connection.c"
                ,"on_cbs_open_complete",0x8e,1,"CBS open failed");
    }
    update_state((AMQP_CONNECTION_INSTANCE_conflict *)context,AMQP_CONNECTION_STATE_ERROR);
  }
  return;
}

Assistant:

static void on_cbs_open_complete(void* context, CBS_OPEN_COMPLETE_RESULT open_complete_result)
{
    (void)open_complete_result;
    if (open_complete_result != CBS_OPEN_OK)
    {
        LogError("CBS open failed");
        update_state((AMQP_CONNECTION_INSTANCE*)context, AMQP_CONNECTION_STATE_ERROR);
    }
}